

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

bool __thiscall
NoMeEdgeCalculator::edgeBetween
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int numGCAllowedPos,
          int ct)

{
  bool bVar1;
  long lVar2;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  bool bVar3;
  bool isClique;
  int in_stack_00001174;
  int in_stack_00001178;
  undefined1 in_stack_0000117f;
  AlignmentRecord *in_stack_00001180;
  AlignmentRecord *in_stack_00001188;
  NoMeEdgeCalculator *in_stack_00001190;
  AlignmentRecord *in_stack_fffffffffffffe38;
  string local_1a8 [39];
  byte local_181;
  string local_180 [39];
  byte local_159;
  string local_158 [32];
  string local_138 [39];
  byte local_111;
  string local_110 [39];
  byte local_e9;
  string local_e8 [39];
  byte local_c1;
  string local_c0 [32];
  string local_a0 [35];
  byte local_7d;
  string local_70 [32];
  string local_50 [39];
  undefined1 local_29;
  AlignmentRecord *local_20;
  AlignmentRecord *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = AlignmentRecord::isStrand1(in_RSI);
  if ((!bVar1) || (bVar1 = AlignmentRecord::isStrand1(local_20), bVar1)) {
    bVar1 = AlignmentRecord::isStrand1(local_18);
    if ((bVar1) || (bVar1 = AlignmentRecord::isStrand1(local_20), !bVar1)) {
      local_29 = 0;
      AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe38);
      lVar2 = std::__cxx11::string::find((char *)local_50,0x3047ff);
      local_7d = 0;
      bVar1 = true;
      if (lVar2 == -1) {
        AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe38);
        local_7d = 1;
        lVar2 = std::__cxx11::string::find((char *)local_70,0x3047ff);
        bVar1 = lVar2 != -1;
      }
      if ((local_7d & 1) != 0) {
        std::__cxx11::string::~string(local_70);
      }
      std::__cxx11::string::~string(local_50);
      if (bVar1) {
        local_29 = 1;
      }
      AlignmentRecord::getCode1_abi_cxx11_(in_stack_fffffffffffffe38);
      lVar2 = std::__cxx11::string::find((char *)local_a0,0x3065e4);
      local_c1 = 0;
      local_e9 = 0;
      local_111 = 0;
      bVar1 = true;
      if (lVar2 == -1) {
        AlignmentRecord::getCode1_abi_cxx11_(in_stack_fffffffffffffe38);
        local_c1 = 1;
        lVar2 = std::__cxx11::string::find((char *)local_c0,0x3065e1);
        bVar1 = true;
        if (lVar2 == -1) {
          AlignmentRecord::getCode2_abi_cxx11_(in_stack_fffffffffffffe38);
          local_e9 = 1;
          lVar2 = std::__cxx11::string::find((char *)local_e8,0x3065e4);
          bVar1 = true;
          if (lVar2 == -1) {
            AlignmentRecord::getCode2_abi_cxx11_(in_stack_fffffffffffffe38);
            local_111 = 1;
            lVar2 = std::__cxx11::string::find((char *)local_110,0x3065e1);
            bVar1 = lVar2 != -1;
          }
        }
      }
      if ((local_111 & 1) != 0) {
        std::__cxx11::string::~string(local_110);
      }
      if ((local_e9 & 1) != 0) {
        std::__cxx11::string::~string(local_e8);
      }
      if ((local_c1 & 1) != 0) {
        std::__cxx11::string::~string(local_c0);
      }
      std::__cxx11::string::~string(local_a0);
      if (bVar1) {
        AlignmentRecord::getCode1_abi_cxx11_(in_stack_fffffffffffffe38);
        lVar2 = std::__cxx11::string::find((char *)local_138,0x3065e4);
        local_159 = 0;
        local_181 = 0;
        bVar3 = false;
        bVar1 = true;
        if (lVar2 == -1) {
          AlignmentRecord::getCode1_abi_cxx11_(in_stack_fffffffffffffe38);
          local_159 = 1;
          lVar2 = std::__cxx11::string::find((char *)local_158,0x3065e1);
          bVar1 = true;
          if (lVar2 == -1) {
            AlignmentRecord::getCode2_abi_cxx11_(in_stack_fffffffffffffe38);
            local_181 = 1;
            lVar2 = std::__cxx11::string::find((char *)local_180,0x3065e4);
            bVar3 = lVar2 == -1;
            bVar1 = true;
            if (bVar3) {
              AlignmentRecord::getCode2_abi_cxx11_(in_stack_fffffffffffffe38);
              lVar2 = std::__cxx11::string::find((char *)local_1a8,0x3065e1);
              bVar1 = lVar2 != -1;
            }
          }
        }
        if (bVar3) {
          std::__cxx11::string::~string(local_1a8);
        }
        if ((local_181 & 1) != 0) {
          std::__cxx11::string::~string(local_180);
        }
        if ((local_159 & 1) != 0) {
          std::__cxx11::string::~string(local_158);
        }
        std::__cxx11::string::~string(local_138);
        if (bVar1) {
          bVar1 = scoreReads(in_stack_00001190,in_stack_00001188,in_stack_00001180,
                             (bool)in_stack_0000117f,in_stack_00001178,in_stack_00001174);
          if (bVar1) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool NoMeEdgeCalculator::edgeBetween(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int numGCAllowedPos, int ct) const{
    if (ap1.isStrand1()&& !ap2.isStrand1()) {
        return false;
    }else if (!ap1.isStrand1()&& ap2.isStrand1()) {
        return false;
    }
    bool isClique = false;
    if((ap1.getName().find("Clique")!=std::string::npos)||(ap2.getName().find("Clique")!=std::string::npos)){
        isClique = true;
    }


      //For Ideal Graph. Assumes that the reads have chroma1 or chroma2 written in their names
//    if((ap1.getName().find("chroma1") != std::string::npos && ap2.getName().find("chroma1") != std::string::npos) || (ap1.getName().find("chroma2") != std::string::npos && ap2.getName().find("chroma2") != std::string::npos)){
//        if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
//            if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
//                if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
//                    return true;
//                }else{
//                    return false;
//                }
//            }else{
//                return false;
//            }
//        }else{
//            return false;
//        }
//    }else{
//        return false;
//    }

    //For normal edge criterion
    if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
        if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
            if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
                return true;
            }else{
                return false;
            }
        }else{
            return false;
        }
    }else{
        return false;
    }
}